

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

void __thiscall
TPZManVector<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>,_20>::Resize
          (TPZManVector<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>,_20> *this,int64_t newsize
          ,TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *object)

{
  ulong uVar1;
  TPZReference *pTVar2;
  ulong *puVar3;
  undefined8 *puVar4;
  ulong uVar5;
  TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *pTVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  double dVar10;
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.",0x27);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    std::ostream::flush();
    return;
  }
  lVar8 = (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fNElements;
  if (newsize != lVar8) {
    lVar7 = (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fNAlloc;
    if (lVar7 < newsize) {
      if ((ulong)newsize < 0x15) {
        if (lVar8 < 1) {
          lVar8 = 0;
        }
        else {
          lVar7 = 0;
          lVar8 = 0;
          do {
            TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>::operator=
                      ((TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)
                       ((long)&this->fExtAlloc[0].fRef + lVar7),
                       (TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)
                       ((long)&((this->
                                super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).
                               fStore)->fRef + lVar7));
            lVar8 = lVar8 + 1;
            lVar7 = lVar7 + 8;
          } while (lVar8 < (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).
                           fNElements);
        }
        lVar7 = newsize - lVar8;
        if (lVar7 != 0 && lVar8 <= newsize) {
          pTVar6 = this->fExtAlloc + lVar8;
          do {
            TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>::operator=(pTVar6,object);
            pTVar6 = pTVar6 + 1;
            lVar7 = lVar7 + -1;
          } while (lVar7 != 0);
        }
        pTVar6 = (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fStore;
        if (pTVar6 != (TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)0x0 &&
            pTVar6 != this->fExtAlloc) {
          pTVar2 = pTVar6[-1].fRef;
          if (pTVar2 != (TPZReference *)0x0) {
            lVar8 = (long)pTVar2 * 8;
            do {
              TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>::~TPZAutoPointer
                        ((TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)
                         ((long)&pTVar6[-1].fRef + lVar8));
              lVar8 = lVar8 + -8;
            } while (lVar8 != 0);
          }
          operator_delete__(pTVar6 + -1,(long)pTVar2 * 8 + 8);
        }
        (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fStore =
             this->fExtAlloc;
        (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fNElements =
             newsize;
        (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fNAlloc = 0x14;
      }
      else {
        dVar10 = (double)lVar7 * 1.2;
        uVar9 = (long)dVar10;
        if (dVar10 < (double)newsize) {
          uVar9 = newsize;
        }
        uVar1 = uVar9 * 8;
        uVar5 = 0xffffffffffffffff;
        if (uVar1 < 0xfffffffffffffff8) {
          uVar5 = uVar1 + 8;
        }
        puVar3 = (ulong *)operator_new__(-(ulong)(uVar9 >> 0x3d != 0) | uVar5);
        *puVar3 = uVar9;
        if (uVar9 != 0) {
          lVar7 = 0;
          do {
            puVar4 = (undefined8 *)operator_new(0x10);
            *(undefined4 *)(puVar4 + 1) = 0;
            *puVar4 = 0;
            LOCK();
            *(undefined4 *)(puVar4 + 1) = 1;
            UNLOCK();
            *(undefined8 **)((long)puVar3 + lVar7 + 8) = puVar4;
            lVar7 = lVar7 + 8;
          } while (uVar1 - lVar7 != 0);
        }
        if (lVar8 < 1) {
          lVar8 = 0;
        }
        else {
          lVar7 = 0;
          lVar8 = 0;
          do {
            TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>::operator=
                      ((TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)
                       ((long)&((TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)(puVar3 + 1))->
                               fRef + lVar7),
                       (TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)
                       ((long)&((this->
                                super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).
                               fStore)->fRef + lVar7));
            lVar8 = lVar8 + 1;
            lVar7 = lVar7 + 8;
          } while (lVar8 < (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).
                           fNElements);
        }
        lVar7 = newsize - lVar8;
        if (lVar7 != 0 && lVar8 <= newsize) {
          pTVar6 = (TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)(puVar3 + lVar8);
          do {
            pTVar6 = pTVar6 + 1;
            TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>::operator=(pTVar6,object);
            lVar7 = lVar7 + -1;
          } while (lVar7 != 0);
        }
        pTVar6 = (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fStore;
        if (pTVar6 != (TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)0x0 &&
            pTVar6 != this->fExtAlloc) {
          pTVar2 = pTVar6[-1].fRef;
          if (pTVar2 != (TPZReference *)0x0) {
            lVar8 = (long)pTVar2 * 8;
            do {
              TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>::~TPZAutoPointer
                        ((TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)
                         ((long)&pTVar6[-1].fRef + lVar8));
              lVar8 = lVar8 + -8;
            } while (lVar8 != 0);
          }
          operator_delete__(pTVar6 + -1,(long)pTVar2 * 8 + 8);
        }
        (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fStore =
             (TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)(puVar3 + 1);
        (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fNElements =
             newsize;
        (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fNAlloc = uVar9;
      }
    }
    else {
      lVar7 = newsize - lVar8;
      if (lVar7 != 0 && lVar8 <= newsize) {
        lVar8 = lVar8 << 3;
        do {
          TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>::operator=
                    ((TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)
                     ((long)&((this->
                              super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).
                             fStore)->fRef + lVar8),object);
          lVar8 = lVar8 + 8;
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
      }
      (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fNElements = newsize;
    }
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}